

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O1

void __thiscall NoViableAltException::NoViableAltException(NoViableAltException *this,RefToken *t)

{
  int iVar1;
  Ref *pRVar2;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"NoViableAlt","");
  ParserException::ParserException(&this->super_ParserException,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_ParserException).super_ANTLRException =
       &PTR__NoViableAltException_00243ab8;
  pRVar2 = t->ref;
  if (pRVar2 == (Ref *)0x0) {
    pRVar2 = (Ref *)0x0;
  }
  else {
    pRVar2->count = pRVar2->count + 1;
  }
  (this->token).ref = pRVar2;
  (this->node).ref = (Ref *)0x0;
  iVar1 = (*t->ref->ptr->_vptr_Token[1])();
  (this->super_ParserException).line = iVar1;
  iVar1 = (**t->ref->ptr->_vptr_Token)();
  (this->super_ParserException).column = iVar1;
  return;
}

Assistant:

NoViableAltException::NoViableAltException(RefToken t)
: ParserException("NoViableAlt") // line ")+t.getLine()+" token is "+t.getText())
, token(t)
, node(0)
{
	line = t->getLine();
	column = t->getColumn();
}